

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3_uri_key(char *zFilename,int N)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int in_ESI;
  char *in_RDI;
  char *in_stack_ffffffffffffffd8;
  char *local_20;
  int local_14;
  char *local_10;
  char *local_8;
  
  if ((in_RDI == (char *)0x0) || (in_ESI < 0)) {
    local_8 = (char *)0x0;
  }
  else {
    local_10 = databaseName(in_RDI);
    iVar2 = sqlite3Strlen30(in_stack_ffffffffffffffd8);
    local_10 = local_10 + (iVar2 + 1);
    local_14 = in_ESI;
    while( true ) {
      bVar1 = false;
      if ((local_10 != (char *)0x0) && (bVar1 = false, *local_10 != '\0')) {
        bVar1 = 0 < local_14;
        local_14 = local_14 + -1;
      }
      if (!bVar1) break;
      iVar2 = sqlite3Strlen30(in_stack_ffffffffffffffd8);
      iVar3 = sqlite3Strlen30(in_stack_ffffffffffffffd8);
      local_10 = local_10 + (long)(iVar3 + 1) + (long)(iVar2 + 1);
    }
    if (*local_10 == '\0') {
      local_20 = (char *)0x0;
    }
    else {
      local_20 = local_10;
    }
    local_8 = local_20;
  }
  return local_8;
}

Assistant:

SQLITE_API const char *sqlite3_uri_key(const char *zFilename, int N){
  if( zFilename==0 || N<0 ) return 0;
  zFilename = databaseName(zFilename);
  zFilename += sqlite3Strlen30(zFilename) + 1;
  while( ALWAYS(zFilename) && zFilename[0] && (N--)>0 ){
    zFilename += sqlite3Strlen30(zFilename) + 1;
    zFilename += sqlite3Strlen30(zFilename) + 1;
  }
  return zFilename[0] ? zFilename : 0;
}